

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O2

void __thiscall World::AdminReport(World *this,Character *from,string *reportee,string *message)

{
  Config *this_00;
  pointer ppCVar1;
  Board *pBVar2;
  pointer pcVar3;
  pointer pcVar4;
  bool bVar5;
  short sVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  mapped_type *pmVar10;
  ulong uVar11;
  Board_Post *this_01;
  time_t tVar12;
  string *psVar13;
  Character *pCVar14;
  pointer ppCVar15;
  double dVar16;
  allocator<char> local_199;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  string *local_178;
  Character *local_170;
  string chat_log_dump;
  Board_Post *newpost;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_108;
  string local_100;
  string local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  PacketBuilder builder;
  Database_Result local_50;
  
  local_178 = reportee;
  local_170 = from;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&chat_log_dump,"ChatMaxWidth",(allocator<char> *)&newpost);
  this_00 = &this->config;
  pmVar10 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)this_00,&chat_log_dump);
  iVar7 = util::variant::GetInt(pmVar10);
  (*(local_170->super_Command_Source)._vptr_Command_Source[2])(&local_e0);
  util::ucfirst(&local_c0,&local_e0);
  std::operator+(&local_a0,&local_c0,"  reports: ");
  std::operator+(&local_128,&local_a0,local_178);
  std::operator+(&local_198,&local_128,", ");
  iVar8 = util::text_width(&local_198);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"...",&local_199);
  util::text_cap((string *)&builder,message,iVar7 - iVar8,&local_100);
  std::__cxx11::string::operator=((string *)message,(string *)&builder);
  std::__cxx11::string::~string((string *)&builder);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&chat_log_dump);
  (*(local_170->super_Command_Source)._vptr_Command_Source[2])(&chat_log_dump);
  PacketBuilder::PacketBuilder
            (&builder,PACKET_ADMININTERACT,PACKET_REPLY,
             local_178->_M_string_length +
             chat_log_dump._M_string_length + message->_M_string_length + 5);
  std::__cxx11::string::~string((string *)&chat_log_dump);
  PacketBuilder::AddChar(&builder,2);
  PacketBuilder::AddByte(&builder,0xff);
  (*(local_170->super_Command_Source)._vptr_Command_Source[2])(&chat_log_dump);
  PacketBuilder::AddBreakString(&builder,&chat_log_dump,0xff);
  std::__cxx11::string::~string((string *)&chat_log_dump);
  PacketBuilder::AddBreakString(&builder,message,0xff);
  PacketBuilder::AddBreakString(&builder,local_178,0xff);
  ppCVar1 = (this->characters).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  local_108 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)&this->admin_config;
  for (ppCVar15 = (this->characters).super__Vector_base<Character_*,_std::allocator<Character_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppCVar15 != ppCVar1;
      ppCVar15 = ppCVar15 + 1) {
    pCVar14 = *ppCVar15;
    uVar9 = (**(pCVar14->super_Command_Source)._vptr_Command_Source)(pCVar14);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&chat_log_dump,"reports",(allocator<char> *)&local_198);
    pmVar10 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[](local_108,&chat_log_dump);
    iVar7 = util::variant::GetInt(pmVar10);
    std::__cxx11::string::~string((string *)&chat_log_dump);
    if (iVar7 <= (int)(uVar9 & 0xff)) {
      Character::Send(pCVar14,&builder);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&chat_log_dump,"AdminBoard",(allocator<char> *)&local_198);
  pmVar10 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)this_00,&chat_log_dump);
  iVar7 = util::variant::GetInt(pmVar10);
  std::__cxx11::string::~string((string *)&chat_log_dump);
  uVar11 = (ulong)(short)((short)iVar7 + -1);
  if (uVar11 < 8) {
    chat_log_dump._M_dataplus._M_p = (pointer)&chat_log_dump.field_2;
    chat_log_dump._M_string_length = 0;
    chat_log_dump.field_2._M_local_buf[0] = '\0';
    pBVar2 = (this->boards)._M_elems[uVar11];
    this_01 = (Board_Post *)operator_new(0x78);
    pCVar14 = local_170;
    Board_Post::Board_Post(this_01);
    sVar6 = (short)*(undefined4 *)&pBVar2->last_id + 1;
    pBVar2->last_id = sVar6;
    this_01->id = sVar6;
    newpost = this_01;
    (*(pCVar14->super_Command_Source)._vptr_Command_Source[2])(&local_198,pCVar14);
    std::__cxx11::string::operator=((string *)&this_01->author,(string *)&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    this_01->author_admin = (uint)pCVar14->admin;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0," [Report] ",&local_199);
    (*(pCVar14->super_Command_Source)._vptr_Command_Source[2])(&local_100,pCVar14);
    util::ucfirst(&local_e0,&local_100);
    std::operator+(&local_a0,&local_c0,&local_e0);
    std::operator+(&local_128,&local_a0," reports: ");
    std::operator+(&local_198,&local_128,local_178);
    std::__cxx11::string::operator=((string *)&this_01->subject,(string *)&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_c0);
    psVar13 = &this_01->body;
    std::__cxx11::string::_M_assign((string *)psVar13);
    dVar16 = Timer::GetTime();
    this_01->time = dVar16;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"ReportChatLogSize",(allocator<char> *)&local_128);
    pmVar10 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_00,&local_198);
    iVar7 = util::variant::GetInt(pmVar10);
    std::__cxx11::string::~string((string *)&local_198);
    if (0 < iVar7) {
      Character::GetChatLogDump_abi_cxx11_(&local_198,pCVar14);
      std::__cxx11::string::operator=((string *)&chat_log_dump,(string *)&local_198);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::append((char *)psVar13);
      pCVar14 = local_170;
      std::__cxx11::string::append((string *)psVar13);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"LogReports",(allocator<char> *)&local_128);
    pmVar10 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_00,&local_198);
    bVar5 = util::variant::GetBool(pmVar10);
    std::__cxx11::string::~string((string *)&local_198);
    if (bVar5) {
      (*(pCVar14->super_Command_Source)._vptr_Command_Source[2])(&local_198,pCVar14);
      pcVar3 = (local_178->_M_dataplus)._M_p;
      pcVar4 = (message->_M_dataplus)._M_p;
      tVar12 = time((time_t *)0x0);
      Database::Query(&local_50,&this->db,
                      "INSERT INTO `reports` (`reporter`, `reported`, `reason`, `time`, `chat_log`) VALUES (\'$\', \'$\', \'$\', #, \'$\')"
                      ,local_198._M_dataplus._M_p,pcVar3,pcVar4,tVar12,
                      chat_log_dump._M_dataplus._M_p);
      std::
      vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
      ::~vector(&local_50.
                 super_vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
               );
      std::__cxx11::string::~string((string *)&local_198);
    }
    std::__cxx11::list<Board_Post_*,_std::allocator<Board_Post_*>_>::push_front
              (&pBVar2->posts,&newpost);
    uVar11 = (pBVar2->posts).super__List_base<Board_Post_*,_std::allocator<Board_Post_*>_>._M_impl.
             _M_node._M_size;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"AdminBoardLimit",(allocator<char> *)&local_128);
    pmVar10 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_00,&local_198);
    iVar7 = util::variant::GetInt(pmVar10);
    std::__cxx11::string::~string((string *)&local_198);
    if ((ulong)(long)iVar7 < uVar11) {
      std::__cxx11::list<Board_Post_*,_std::allocator<Board_Post_*>_>::pop_back(&pBVar2->posts);
    }
    std::__cxx11::string::~string((string *)&chat_log_dump);
  }
  PacketBuilder::~PacketBuilder(&builder);
  return;
}

Assistant:

void World::AdminReport(Character *from, std::string reportee, std::string message)
{
	message = util::text_cap(message, static_cast<int>(this->config["ChatMaxWidth"]) - util::text_width(util::ucfirst(from->SourceName()) + "  reports: " + reportee + ", "));

	PacketBuilder builder(PACKET_ADMININTERACT, PACKET_REPLY, 5 + from->SourceName().length() + message.length() + reportee.length());
	builder.AddChar(2); // message type
	builder.AddByte(255);
	builder.AddBreakString(from->SourceName());
	builder.AddBreakString(message);
	builder.AddBreakString(reportee);

	UTIL_FOREACH(this->characters, character)
	{
		if (character->SourceAccess() >= static_cast<int>(this->admin_config["reports"]))
		{
			character->Send(builder);
		}
	}

	short boardid = static_cast<int>(this->config["AdminBoard"]) - 1;

	if (static_cast<std::size_t>(boardid) < this->boards.size())
	{
		std::string chat_log_dump;
		Board *admin_board = this->boards[boardid];

		Board_Post *newpost = new Board_Post;
		newpost->id = ++admin_board->last_id;
		newpost->author = from->SourceName();
		newpost->author_admin = from->admin;
		newpost->subject = std::string(" [Report] ") + util::ucfirst(from->SourceName()) + " reports: " + reportee;
		newpost->body = message;
		newpost->time = Timer::GetTime();

		if (int(this->config["ReportChatLogSize"]) > 0)
		{
			chat_log_dump = from->GetChatLogDump();
			newpost->body += "\r\n\r\n";
			newpost->body += chat_log_dump;
		}

		if (this->config["LogReports"])
		{
			try
			{
				this->db.Query("INSERT INTO `reports` (`reporter`, `reported`, `reason`, `time`, `chat_log`) VALUES ('$', '$', '$', #, '$')",
					from->SourceName().c_str(),
					reportee.c_str(),
					message.c_str(),
					int(std::time(0)),
					chat_log_dump.c_str()
				);
			}
			catch (Database_Exception& e)
			{
				Console::Err("Could not save report to database.");
				Console::Err("%s", e.error());
			}
		}

		admin_board->posts.push_front(newpost);

		if (admin_board->posts.size() > static_cast<std::size_t>(static_cast<int>(this->config["AdminBoardLimit"])))
		{
			admin_board->posts.pop_back();
		}
	}
}